

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

Opcode __thiscall Jinx::Impl::Parser::ParseBinaryOperator(Parser *this)

{
  Opcode OVar1;
  pointer pSVar2;
  
  if (this->m_error != false) {
    return NumOpcodes;
  }
  pSVar2 = (this->m_currentSymbol)._M_current;
  if (pSVar2 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    return NumOpcodes;
  }
  switch(pSVar2->type) {
  case ForwardSlash:
    OVar1 = Divide;
    break;
  case Asterisk:
    OVar1 = Multiply;
    break;
  case Plus:
    OVar1 = Add;
    break;
  case Minus:
    OVar1 = Subtract;
    break;
  case Equals:
    OVar1 = Equals;
    break;
  case NotEquals:
    OVar1 = NotEquals;
    break;
  case Percent:
    OVar1 = Mod;
    break;
  case LessThan:
    OVar1 = Less;
    break;
  case LessThanEquals:
    OVar1 = LessEq;
    break;
  case GreaterThan:
    OVar1 = Greater;
    break;
  case GreaterThanEquals:
    OVar1 = GreaterEq;
    break;
  case And:
    OVar1 = And;
    break;
  default:
    if (pSVar2->type == Or) {
      OVar1 = Or;
      break;
    }
  case Comma:
  case ParenOpen:
  case ParenClose:
  case CurlyOpen:
  case CurlyClose:
  case SquareOpen:
  case SquareClose:
  case Ellipse:
  case SingleQuote:
    Error<>(this,"Unknown type when parsing binary operator");
    pSVar2 = (this->m_currentSymbol)._M_current;
    OVar1 = NumOpcodes;
  }
  this->m_lastLine = pSVar2->lineNumber;
  (this->m_currentSymbol)._M_current = pSVar2 + 1;
  return OVar1;
}

Assistant:

inline_t Opcode Parser::ParseBinaryOperator()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return Opcode::NumOpcodes;

		Opcode opcode = Opcode::NumOpcodes;
		switch (m_currentSymbol->type)
		{
		case SymbolType::And:
			opcode = Opcode::And;
			break;
		case SymbolType::Asterisk:
			opcode = Opcode::Multiply;
			break;
		case SymbolType::Equals:
			opcode = Opcode::Equals;
			break;
		case SymbolType::NotEquals:
			opcode = Opcode::NotEquals;
			break;
		case SymbolType::ForwardSlash:
			opcode = Opcode::Divide;
			break;
		case SymbolType::GreaterThan:
			opcode = Opcode::Greater;
			break;
		case SymbolType::GreaterThanEquals:
			opcode = Opcode::GreaterEq;
			break;
		case SymbolType::LessThan:
			opcode = Opcode::Less;
			break;
		case SymbolType::LessThanEquals:
			opcode = Opcode::LessEq;
			break;
		case SymbolType::Minus:
			opcode = Opcode::Subtract;
			break;
		case SymbolType::Or:
			opcode = Opcode::Or;
			break;
		case SymbolType::Percent:
			opcode = Opcode::Mod;
			break;
		case SymbolType::Plus:
			opcode = Opcode::Add;
			break;
		default:
			Error("Unknown type when parsing binary operator");
			break;
		}
		NextSymbol();
		return opcode;
	}